

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

Mat * ncnn::Mat::from_pixels_resize
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                int target_width,int target_height,Allocator *allocator)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  Mat dst;
  void *ptr;
  
  if (h == target_height && w == target_width) {
    from_pixels(__return_storage_ptr__,pixels,type,w,h,stride,allocator);
  }
  else if ((type & 0xffffU) - 1 < 2) {
    dst.data = (void *)0x0;
    piVar1 = (int *)0x0;
    if (target_height * target_width != 0) {
      uVar3 = (long)(target_height * target_width) * 3 + 3U & 0xfffffffffffffffc;
      ptr = (void *)0x0;
      iVar2 = posix_memalign(&ptr,0x10,uVar3 + 4);
      if (iVar2 != 0) {
        ptr = (void *)0x0;
      }
      dst.data = ptr;
      piVar1 = (int *)((long)ptr + uVar3);
      *(undefined4 *)((long)ptr + uVar3) = 1;
    }
    resize_bilinear_c3(pixels,w,h,stride,(uchar *)dst.data,target_width,target_height,
                       target_width * 3);
    from_pixels(__return_storage_ptr__,(uchar *)dst.data,type,target_width,target_height,allocator);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) && (dst.data != (void *)0x0)) {
        free(dst.data);
      }
    }
  }
  else {
    if ((type & 0xffffU) == 3) {
      dst.data = (void *)0x0;
      piVar1 = (int *)0x0;
      if (target_height * target_width != 0) {
        uVar3 = (long)(target_height * target_width) + 3U & 0xfffffffffffffffc;
        ptr = (void *)0x0;
        iVar2 = posix_memalign(&ptr,0x10,uVar3 + 4);
        if (iVar2 != 0) {
          ptr = (void *)0x0;
        }
        dst.data = ptr;
        piVar1 = (int *)((long)ptr + uVar3);
        *(undefined4 *)((long)ptr + uVar3) = 1;
      }
      resize_bilinear_c1(pixels,w,h,stride,(uchar *)dst.data,target_width,target_height,target_width
                        );
      from_pixels(__return_storage_ptr__,(uchar *)dst.data,type,target_width,target_height,allocator
                 );
      if (piVar1 == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *piVar1 = *piVar1 + -1;
      iVar2 = *piVar1;
      UNLOCK();
    }
    else {
      if ((type & 0xfffeU) != 4) {
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
        return __return_storage_ptr__;
      }
      dst.data = (void *)0x0;
      piVar1 = (int *)0x0;
      iVar2 = target_height * target_width;
      if (iVar2 != 0) {
        lVar4 = (long)iVar2 * 4;
        ptr = (void *)0x0;
        iVar2 = posix_memalign(&ptr,0x10,(long)iVar2 * 4 + 4);
        if (iVar2 != 0) {
          ptr = (void *)0x0;
        }
        dst.data = ptr;
        piVar1 = (int *)((long)ptr + lVar4);
        *(undefined4 *)((long)ptr + lVar4) = 1;
      }
      resize_bilinear_c4(pixels,w,h,stride,(uchar *)dst.data,target_width,target_height,
                         target_width * 4);
      from_pixels(__return_storage_ptr__,(uchar *)dst.data,type,target_width,target_height,allocator
                 );
      if (piVar1 == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *piVar1 = *piVar1 + -1;
      iVar2 = *piVar1;
      UNLOCK();
    }
    if ((iVar2 == 0) && (dst.data != (void *)0x0)) {
      free(dst.data);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int stride, int target_width, int target_height, Allocator* allocator)
{
    if (w == target_width && h == target_height)
        return Mat::from_pixels(pixels, type, w, h, stride, allocator);

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        Mat dst(target_width, target_height, (size_t)3u, 3);
        resize_bilinear_c3(pixels, w, h, stride, dst, target_width, target_height, target_width * 3);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        Mat dst(target_width, target_height, (size_t)1u, 1);
        resize_bilinear_c1(pixels, w, h, stride, dst, target_width, target_height, target_width * 1);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        Mat dst(target_width, target_height, (size_t)4u, 4);
        resize_bilinear_c4(pixels, w, h, stride, dst, target_width, target_height, target_width * 4);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }

    // unknown convert type
    return Mat();
}